

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::CumulativeReporterBase::assertionEnded
          (CumulativeReporterBase *this,AssertionStats *assertionStats)

{
  bool bVar1;
  reference ppSVar2;
  AssertionResult *in_RDI;
  SectionNode *sectionNode;
  vector<Catch::Detail::AssertionOrBenchmarkResult,_std::allocator<Catch::Detail::AssertionOrBenchmarkResult>_>
  *in_stack_ffffffffffffffb0;
  string local_30 [8];
  AssertionResult *in_stack_ffffffffffffffd8;
  
  if ((((in_RDI->m_resultData).reconstructedExpression._M_string_length & 0x100) != 0) &&
     (bVar1 = AssertionResult::isOk(in_RDI), !bVar1)) {
    AssertionResult::getExpandedExpression_abi_cxx11_(in_stack_ffffffffffffffd8);
    std::__cxx11::string::~string(local_30);
  }
  if ((((in_RDI->m_resultData).reconstructedExpression._M_string_length & 1) != 0) &&
     (bVar1 = AssertionResult::isOk(in_RDI), bVar1)) {
    AssertionResult::getExpandedExpression_abi_cxx11_(in_stack_ffffffffffffffd8);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  }
  ppSVar2 = std::
            vector<Catch::CumulativeReporterBase::SectionNode_*,_std::allocator<Catch::CumulativeReporterBase::SectionNode_*>_>
            ::back((vector<Catch::CumulativeReporterBase::SectionNode_*,_std::allocator<Catch::CumulativeReporterBase::SectionNode_*>_>
                    *)in_RDI);
  std::
  vector<Catch::Detail::AssertionOrBenchmarkResult,std::allocator<Catch::Detail::AssertionOrBenchmarkResult>>
  ::emplace_back<Catch::AssertionStats_const&>(in_stack_ffffffffffffffb0,(AssertionStats *)*ppSVar2)
  ;
  return;
}

Assistant:

void CumulativeReporterBase::assertionEnded(
        AssertionStats const& assertionStats ) {
        assert( !m_sectionStack.empty() );
        // AssertionResult holds a pointer to a temporary DecomposedExpression,
        // which getExpandedExpression() calls to build the expression string.
        // Our section stack copy of the assertionResult will likely outlive the
        // temporary, so it must be expanded or discarded now to avoid calling
        // a destroyed object later.
        if ( m_shouldStoreFailedAssertions &&
             !assertionStats.assertionResult.isOk() ) {
            static_cast<void>(
                assertionStats.assertionResult.getExpandedExpression() );
        }
        if ( m_shouldStoreSuccesfulAssertions &&
             assertionStats.assertionResult.isOk() ) {
            static_cast<void>(
                assertionStats.assertionResult.getExpandedExpression() );
        }
        SectionNode& sectionNode = *m_sectionStack.back();
        sectionNode.assertionsAndBenchmarks.emplace_back( assertionStats );
    }